

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.hpp
# Opt level: O0

String * Diligent::GetObjectDescString<Diligent::TextureDesc>
                   (String *__return_storage_ptr__,TextureDesc *TexDesc)

{
  TextureDesc *Desc;
  String local_50;
  allocator local_1a;
  undefined1 local_19;
  TextureDesc *local_18;
  TextureDesc *TexDesc_local;
  String *Str;
  
  local_19 = 0;
  local_18 = TexDesc;
  TexDesc_local = (TextureDesc *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,"Tex desc: ",&local_1a);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a);
  GetTextureDescString_abi_cxx11_(&local_50,(Diligent *)local_18,Desc);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

inline String GetObjectDescString(const TextureDesc& TexDesc)
{
    String Str{"Tex desc: "};
    Str += GetTextureDescString(TexDesc);
    return Str;
}